

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginElemExpr
          (BinaryReaderInterp *this,Index elem_index,Index expr_index)

{
  pointer pEVar1;
  pointer pFVar2;
  Result RVar3;
  ValueType local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_c8;
  FuncDesc local_a8;
  
  pEVar1 = (this->module_->elems).
           super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (((long)pEVar1 -
      (long)(this->module_->elems).
            super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
            _M_impl.super__Vector_impl_data._M_start) / 0xa0 - 1U != (ulong)elem_index) {
    __assert_fail("elem_index == module_.elems.size() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                  ,0x2f6,
                  "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::BeginElemExpr(Index, Index)"
                 );
  }
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = pEVar1[-1].type;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_e8,&local_f0);
  FuncType::FuncType(&local_a8.type,(ValueTypes *)&local_c8,(ValueTypes *)&local_e8);
  local_a8.locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.locals.
  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.code_offset = 0xffffffff;
  local_a8.handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.handlers.
  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::
  emplace_back<wabt::interp::FuncDesc>(&pEVar1[-1].elements,&local_a8);
  FuncDesc::~FuncDesc(&local_a8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_e8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_c8);
  pFVar2 = pEVar1[-1].elements.
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (((long)pFVar2 -
      (long)pEVar1[-1].elements.
            super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
            _M_impl.super__Vector_impl_data._M_start) / 0x78 - 1U == (ulong)expr_index) {
    RVar3 = BeginInitExpr(this,pFVar2 + -1);
    return (Result)RVar3.enum_;
  }
  __assert_fail("expr_index == elem.elements.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                ,0x2fa,
                "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::BeginElemExpr(Index, Index)"
               );
}

Assistant:

Result BinaryReaderInterp::BeginElemExpr(Index elem_index, Index expr_index) {
  assert(elem_index == module_.elems.size() - 1);
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(
      {FuncType{{}, {elem.type}}, {}, Istream::kInvalidOffset, {}});
  assert(expr_index == elem.elements.size() - 1);
  return BeginInitExpr(&elem.elements.back());
}